

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

absolute_lookup * __thiscall
absl::lts_20240722::time_internal::cctz::TimeZoneInfo::LocalTime
          (absolute_lookup *__return_storage_ptr__,TimeZoneInfo *this,int_fast64_t unix_time,
          TransitionType *tt)

{
  int_least64_t this_00;
  char *pcVar1;
  civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag> a;
  civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag> a_00;
  fields fVar2;
  civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag> local_40;
  fields local_30;
  TransitionType *local_20;
  TransitionType *tt_local;
  int_fast64_t unix_time_local;
  TimeZoneInfo *this_local;
  
  local_20 = tt;
  tt_local = (TransitionType *)unix_time;
  unix_time_local = (int_fast64_t)this;
  detail::civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>::civil_time
            (&local_40);
  a.f_._8_8_ = tt_local;
  a.f_.y._0_1_ = local_40.f_.m;
  a.f_.y._1_1_ = local_40.f_.d;
  a.f_.y._2_1_ = local_40.f_.hh;
  a.f_.y._3_1_ = local_40.f_.mm;
  a.f_.y._4_1_ = local_40.f_.ss;
  a.f_.y._5_3_ = local_40.f_._13_3_;
  fVar2 = (fields)detail::operator+((detail *)local_40.f_.y,a,(diff_t)tt);
  a_00.f_._8_8_ = (long)local_20->utc_offset;
  local_30.y = fVar2.y;
  local_30._8_8_ = fVar2._8_8_;
  a_00.f_.y._0_1_ = local_30.m;
  a_00.f_.y._1_1_ = local_30.d;
  a_00.f_.y._2_1_ = local_30.hh;
  a_00.f_.y._3_1_ = local_30.mm;
  a_00.f_.y._4_1_ = local_30.ss;
  a_00.f_.y._5_3_ = local_30._13_3_;
  this_00 = local_30.y;
  local_30 = fVar2;
  fVar2 = (fields)detail::operator+((detail *)this_00,a_00,(diff_t)tt);
  (__return_storage_ptr__->cs).f_ = fVar2;
  __return_storage_ptr__->offset = local_20->utc_offset;
  __return_storage_ptr__->is_dst = (bool)(local_20->is_dst & 1);
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)&this->abbreviations_);
  __return_storage_ptr__->abbr = pcVar1;
  return __return_storage_ptr__;
}

Assistant:

time_zone::absolute_lookup TimeZoneInfo::LocalTime(
    std::int_fast64_t unix_time, const TransitionType& tt) const {
  // A civil time in "+offset" looks like (time+offset) in UTC.
  // Note: We perform two additions in the civil_second domain to
  // sidestep the chance of overflow in (unix_time + tt.utc_offset).
  return {(civil_second() + unix_time) + tt.utc_offset, tt.utc_offset,
          tt.is_dst, &abbreviations_[tt.abbr_index]};
}